

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFS.hpp
# Opt level: O2

int __thiscall
webfront::fs::detail::NativeRawFS::open(NativeRawFS *this,char *__file,int __oflag,...)

{
  char cVar1;
  File local_680;
  ifstream file;
  ifstream local_220 [520];
  
  std::ifstream::ifstream(&file);
  std::filesystem::__cxx11::operator/((path *)&local_680,(path *)__file,___oflag);
  std::ifstream::open((char *)&file,local_680.fileType);
  http::std::filesystem::__cxx11::path::~path((path *)&local_680);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    *(undefined1 *)&this[0xf].rootPath._M_pathname._M_dataplus._M_p = 0;
  }
  else {
    std::ifstream::ifstream(local_220,&file);
    File::File(&local_680,local_220);
    http::std::_Optional_payload_base<webfront::fs::File>::
    _Optional_payload_base<webfront::fs::File>
              ((_Optional_payload_base<webfront::fs::File> *)this,&local_680);
    File::~File(&local_680);
    std::ifstream::~ifstream(local_220);
  }
  std::ifstream::~ifstream(&file);
  return (int)this;
}

Assistant:

std::optional<File> open(std::filesystem::path path) {
        std::ifstream file;
        file.open(rootPath / path, std::ios::binary);
        if (file.is_open()) return File{std::move(file)};
        return {};
    }